

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O0

void __thiscall kpeg::MCU::computeIDCT(MCU *this)

{
  int iVar1;
  Level LVar2;
  Logger *pLVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  char *pcVar7;
  void *pvVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  float Cv;
  float Cu;
  int v;
  int u;
  float sum;
  int x;
  int y;
  int i;
  size_type in_stack_fffffffffffffe88;
  array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *in_stack_fffffffffffffe90;
  char *local_138;
  double local_f8;
  double local_f0;
  char *local_a8;
  string local_78 [36];
  float in_stack_ffffffffffffffac;
  int local_4c;
  int local_48;
  float local_44;
  int local_40;
  int local_3c;
  int local_38;
  string local_28 [40];
  
  pLVar3 = Logger::get();
  LVar2 = Logger::getLevel(pLVar3);
  if (1 < (int)LVar2) {
    pLVar3 = Logger::get();
    poVar6 = Logger::getStream(pLVar3);
    Logger::levelStr_abi_cxx11_((Level)in_stack_ffffffffffffffac);
    poVar6 = std::operator<<(poVar6,local_28);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                     ,0x2f);
    if (pcVar7 == (char *)0x0) {
      local_a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
      ;
    }
    else {
      local_a8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                         ,0x2f);
      local_a8 = local_a8 + 1;
    }
    poVar6 = std::operator<<(poVar6,local_a8);
    poVar6 = std::operator<<(poVar6,":");
    pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
    poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0xae);
    poVar6 = std::operator<<(poVar6," ] ");
    poVar6 = std::operator<<(poVar6,"Performing IDCT on MCU: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    poVar6 = std::operator<<(poVar6,"...");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
        local_44 = 0.0;
        for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
          for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
            if (local_48 == 0) {
              local_f0 = sqrt(2.0);
              local_f0 = 1.0 / local_f0;
            }
            else {
              local_f0 = 1.0;
            }
            if (local_4c == 0) {
              local_f8 = sqrt(2.0);
              local_f8 = 1.0 / local_f8;
            }
            else {
              local_f8 = 1.0;
            }
            in_stack_ffffffffffffffac = (float)local_f8;
            fVar9 = (float)local_f0 * in_stack_ffffffffffffffac;
            std::array<std::array<std::array<int,_8UL>,_8UL>,_3UL>::operator[]
                      ((array<std::array<std::array<int,_8UL>,_8UL>,_3UL> *)
                       in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            std::array<std::array<int,_8UL>,_8UL>::operator[]
                      ((array<std::array<int,_8UL>,_8UL> *)in_stack_fffffffffffffe90,
                       in_stack_fffffffffffffe88);
            pvVar4 = std::array<int,_8UL>::operator[]
                               ((array<int,_8UL> *)in_stack_fffffffffffffe90,
                                in_stack_fffffffffffffe88);
            iVar1 = *pvVar4;
            dVar10 = cos(((double)((local_40 * 2 + 1) * local_48) * 3.141592653589793) / 16.0);
            dVar11 = cos(((double)((local_3c * 2 + 1) * local_4c) * 3.141592653589793) / 16.0);
            local_44 = (float)((double)(fVar9 * (float)iVar1) * dVar10 * dVar11 + (double)local_44);
          }
        }
        std::array<std::array<std::array<float,_8UL>,_8UL>,_3UL>::operator[]
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        std::array<std::array<float,_8UL>,_8UL>::operator[]
                  (in_stack_fffffffffffffe90->_M_elems,in_stack_fffffffffffffe88);
        pvVar5 = std::array<float,_8UL>::operator[]
                           ((array<float,_8UL> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                           );
        *pvVar5 = local_44 * 0.25;
      }
    }
  }
  pLVar3 = Logger::get();
  LVar2 = Logger::getLevel(pLVar3);
  if (1 < (int)LVar2) {
    pLVar3 = Logger::get();
    poVar6 = Logger::getStream(pLVar3);
    Logger::levelStr_abi_cxx11_((Level)in_stack_ffffffffffffffac);
    poVar6 = std::operator<<(poVar6,local_78);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    pcVar7 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                     ,0x2f);
    if (pcVar7 == (char *)0x0) {
      local_138 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
      ;
    }
    else {
      local_138 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                          ,0x2f);
      local_138 = local_138 + 1;
    }
    poVar6 = std::operator<<(poVar6,local_138);
    poVar6 = std::operator<<(poVar6,":");
    pvVar8 = (void *)std::ostream::operator<<(poVar6,std::dec);
    poVar6 = (ostream *)std::ostream::operator<<(pvVar8,0xd7);
    poVar6 = std::operator<<(poVar6," ] ");
    poVar6 = std::operator<<(poVar6,"IDCT of MCU: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,m_MCUCount);
    poVar6 = std::operator<<(poVar6," complete [OK]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void MCU::computeIDCT()
    {
        LOG(Logger::Level::DEBUG) << "Performing IDCT on MCU: " << m_MCUCount << "..." << std::endl;
        
        for ( int i = 0; i <3; ++i )
        {
            for ( int y = 0; y < 8; ++y )
            {
                for ( int x = 0; x < 8; ++x )
                {
                    float sum = 0.0;
                    
                    for ( int u = 0; u < 8; ++u )
                    //for ( int v = 0; v < 8; ++v )
                    {
                        for ( int v = 0; v < 8; ++v )
                        //for ( int u = 0; u < 8; ++u )
                        {
                            float Cu = u == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            float Cv = v == 0 ? 1.0 / std::sqrt(2.0) : 1.0;
                            
                            sum += Cu * Cv * m_8x8block[i][u][v] * std::cos( ( 2 * x + 1 ) * u * M_PI / 16.0 ) *
                                            std::cos( ( 2 * y + 1 ) * v * M_PI / 16.0 );
                        }
                    }
                    
                    icoeffs[i][x][y] = 0.25 * sum;
                }
            }
        }
        
//         for (auto&& mat: icoeffs )
//         {
//             for ( auto&& row : mat )
//             {
//                 for ( auto&& v : row )
//                     //std::cout << std::roundl( v ) + 128 << "\t";
//                     std::cout << std::roundl( v ) << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;
//         }

        LOG(Logger::Level::DEBUG) << "IDCT of MCU: " << m_MCUCount << " complete [OK]" << std::endl;
    }